

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFTextString.cpp
# Opt level: O0

void __thiscall PDFTextString::ConvertFromUTF8(PDFTextString *this,string *inStringToConvert)

{
  bool bVar1;
  string local_a0;
  undefined1 local_80 [8];
  EStatusCodeAndString result;
  UnicodeString unicodeString;
  undefined1 local_30 [8];
  OutputStringBufferStream aStringStream;
  string *inStringToConvert_local;
  PDFTextString *this_local;
  
  aStringStream._16_8_ = inStringToConvert;
  OutputStringBufferStream::OutputStringBufferStream((OutputStringBufferStream *)local_30);
  bVar1 = ConvertUTF8ToPDFDocEncoding
                    (this,(string *)aStringStream._16_8_,(OutputStringBufferStream *)local_30);
  if (bVar1) {
    OutputStringBufferStream::ToString_abi_cxx11_(&local_a0,(OutputStringBufferStream *)local_30);
    std::__cxx11::string::operator=((string *)this,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    UnicodeString::UnicodeString((UnicodeString *)((long)&result.second.field_2 + 8));
    UnicodeString::FromUTF8
              ((UnicodeString *)((long)&result.second.field_2 + 8),(string *)aStringStream._16_8_);
    UnicodeString::ToUTF16BE_abi_cxx11_
              ((EStatusCodeAndString *)local_80,(UnicodeString *)((long)&result.second.field_2 + 8),
               true);
    std::__cxx11::string::operator=((string *)this,(string *)&result);
    std::
    pair<PDFHummus::EStatusCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<PDFHummus::EStatusCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_80);
    UnicodeString::~UnicodeString((UnicodeString *)((long)&result.second.field_2 + 8));
  }
  OutputStringBufferStream::~OutputStringBufferStream((OutputStringBufferStream *)local_30);
  return;
}

Assistant:

void PDFTextString::ConvertFromUTF8(const std::string& inStringToConvert)
{
	OutputStringBufferStream aStringStream;

	if(!ConvertUTF8ToPDFDocEncoding(inStringToConvert,aStringStream))
	{
		// if no DOC encoding then convert to utf16BE (with BOM)
		
		UnicodeString unicodeString;
		unicodeString.FromUTF8(inStringToConvert);
		EStatusCodeAndString result = unicodeString.ToUTF16BE(true);
		
		mTextString = result.second;

	}
	else
	{
		mTextString = aStringStream.ToString();
	}
}